

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool aedit_prog(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  void *pvVar2;
  size_t sVar3;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *txt;
  CHAR_DATA *extraout_RDX;
  char *in_RSI;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  *this;
  v9 *this_00;
  long in_RDI;
  uint clearmem;
  bool found;
  AREA_DATA_conflict *pArea;
  string buffer;
  char prog_type [4608];
  char prog [4608];
  char add [4608];
  char buf [4608];
  int col;
  int count;
  char *in_stack_ffffffffffffb2b8;
  string *psVar4;
  char *in_stack_ffffffffffffb2c0;
  CHAR_DATA *in_stack_ffffffffffffb2c8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffb2d0;
  char *in_stack_ffffffffffffb2d8;
  size_t *psVar5;
  AREA_DATA_conflict *in_stack_ffffffffffffb2e0;
  char *in_stack_ffffffffffffb2e8;
  char *local_4c50;
  size_t local_4c48;
  string local_4c40 [32];
  char *local_4c20 [2];
  string local_4c10 [32];
  char (*local_4bf0 [2]) [4608];
  string local_4be0 [32];
  char *local_4bc0 [2];
  string local_4bb0 [36];
  uint local_4b8c;
  undefined4 local_4b88;
  byte local_4b71;
  long local_4b70;
  string local_4b68 [32];
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  local_4b48 [6];
  format_args in_stack_ffffffffffffb520;
  string_view in_stack_ffffffffffffb530;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  local_3948 [576];
  char local_1548 [4608];
  int local_348;
  int local_344;
  char *local_340;
  long local_338;
  byte local_329;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_328 [2];
  undefined8 local_318;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_310;
  char *local_308;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_2f8;
  char *local_2f0;
  size_t sStack_2e8;
  string *local_2e0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_2d8 [2];
  undefined8 local_2c8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_2c0;
  char *local_2b8;
  size_t local_2b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_2a8;
  char *local_2a0;
  size_t sStack_298;
  string *local_290;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_288 [2];
  undefined8 local_278;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_270;
  char *local_268;
  size_t local_260;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  *local_258;
  char *local_250;
  size_t sStack_248;
  string *local_240;
  char *local_238;
  char **local_230;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char[4608]>
  local_228;
  undefined8 local_208;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char[4608]>
  *local_200;
  char (*local_1f8) [4608];
  size_t local_1f0;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  *local_1e8;
  v9 *local_1e0;
  char (*local_1d8) [4608];
  size_t sStack_1d0;
  string *local_1c8;
  char *local_1c0;
  char **local_1b8;
  char *local_1b0;
  char (**local_1a8) [4608];
  char *local_1a0;
  char **local_198;
  char *local_190;
  char **local_188;
  char *local_180;
  char (**local_178) [4608];
  char *local_170;
  char **local_168;
  char *local_160;
  char **local_158;
  char **local_150;
  char *local_148;
  size_t sStack_140;
  char **local_130;
  char *local_128;
  size_t sStack_120;
  char **local_110;
  char *local_108;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_f8;
  undefined8 *local_f0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_e8;
  undefined8 local_e0;
  undefined8 *local_d8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_d0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_c8;
  undefined8 *local_c0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_b8;
  undefined8 local_b0;
  undefined8 *local_a8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_a0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_98;
  undefined8 *local_90;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_88;
  undefined8 local_80;
  undefined8 *local_78;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_70;
  char *local_68;
  char (**local_60) [4608];
  char (*local_58) [4608];
  size_t sStack_50;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char[4608]>
  *local_48;
  undefined8 *local_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char[4608]>
  *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char[4608]>
  *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_344 = 0;
  local_348 = 0;
  local_340 = in_RSI;
  local_338 = in_RDI;
  std::__cxx11::string::string(local_4b68);
  local_4b71 = 0;
  local_4b70 = *(long *)(*(long *)(local_338 + 0x80) + 0x6c60);
  if (*local_340 == '\0') {
    send_to_char(in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8);
    local_344 = 0;
    while (aprog_table[local_344].type != (char *)0x0) {
      if (*(int *)(*(long *)(local_338 + 0xc0) + 0xd44) < 10) {
        bVar1 = str_cmp(*(char **)(*(long *)(*(long *)(local_338 + 0xa8) + 0x30) + 0x40),
                        aprog_table[local_344].owner);
        if (!bVar1) {
          sprintf(local_1548,"%s ",aprog_table[local_344].name);
          send_to_char(in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8);
          local_348 = local_348 + 1;
        }
      }
      else {
        sprintf(local_1548,"%s ",aprog_table[local_344].name);
        send_to_char(in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8);
        local_348 = local_348 + 1;
      }
      if ((local_348 % 4 == 0) && (0 < local_348)) {
        send_to_char(in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8);
      }
      local_344 = local_344 + 1;
    }
    if (local_348 % 4 != 0) {
      send_to_char(in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8);
    }
  }
  else {
    local_340 = one_argument(in_stack_ffffffffffffb2c0,in_stack_ffffffffffffb2b8);
    this = local_3948;
    local_340 = one_argument(in_stack_ffffffffffffb2c0,in_stack_ffffffffffffb2b8);
    if ((bool)local_3948[0]._0_1_ == false) {
      send_to_char(in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8);
      local_329 = 0;
      goto LAB_0077b5ac;
    }
    if (*(long *)(local_4b70 + 0x20) == 0) {
      pvVar2 = operator_new(0x60);
      *(void **)(local_4b70 + 0x20) = pvVar2;
      for (local_4b8c = 0; local_4b8c < 0x60; local_4b8c = local_4b8c + 1) {
        *(undefined1 *)(*(long *)(local_4b70 + 0x20) + (ulong)local_4b8c) = 0;
      }
    }
    local_344 = 0;
    while (aprog_table[local_344].type != (char *)0x0) {
      this = local_3948;
      bVar1 = str_cmp(aprog_table[local_344].name,(char *)&this->int_value);
      if (!bVar1) {
        this = (anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
                *)0x7f0704;
        sprintf((char *)local_4b48,"%s",aprog_table[local_344].type);
        local_4b71 = 1;
      }
      local_344 = local_344 + 1;
    }
    if ((local_4b71 & 1) == 0) {
      local_230 = local_4bc0;
      local_238 = "{} is not a valid program to choose from.\n\r";
      local_160 = "{} is not a valid program to choose from.\n\r";
      local_4bc0[0] = "{} is not a valid program to choose from.\n\r";
      local_158 = local_230;
      local_260 = std::char_traits<char>::length((char_type *)0x77ac30);
      local_68 = local_238;
      local_240 = local_4bb0;
      local_250 = local_4bc0[0];
      local_258 = local_3948;
      local_150 = &local_250;
      local_268 = local_4bc0[0];
      sStack_248 = local_260;
      local_148 = local_268;
      sStack_140 = local_260;
      local_288[0] = fmt::v9::
                     make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                               ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
                                 *)&local_258->string,(v9 *)&this->string,(char (*) [4608])local_240
                               );
      local_f0 = &local_278;
      local_f8 = local_288;
      local_e0 = 0xc;
      local_278 = 0xc;
      local_e8 = local_f8;
      local_d8 = local_f0;
      local_d0 = local_f8;
      local_270 = local_f8;
      fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb530,in_stack_ffffffffffffb520);
      std::__cxx11::string::operator=(local_4b68,local_4bb0);
      std::__cxx11::string::~string(local_4bb0);
      std::__cxx11::string::c_str();
      send_to_char(in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8);
      local_329 = 0;
      goto LAB_0077b5ac;
    }
    bVar1 = str_prefix(in_stack_ffffffffffffb2e8,(char *)in_stack_ffffffffffffb2e0);
    if (bVar1) {
      bVar1 = str_prefix(in_stack_ffffffffffffb2e8,(char *)in_stack_ffffffffffffb2e0);
      if (!bVar1) {
        this_00 = (v9 *)local_4b48;
        bVar1 = aprog_unset((AREA_DATA_conflict *)in_stack_ffffffffffffb2c8,
                            in_stack_ffffffffffffb2c0,in_stack_ffffffffffffb2b8);
        if (!bVar1) {
          local_1b8 = &local_4c50;
          local_1c0 = "The \'{}\' field is not set.\n\r";
          local_170 = "The \'{}\' field is not set.\n\r";
          local_4c50 = "The \'{}\' field is not set.\n\r";
          psVar5 = &local_4c48;
          local_168 = local_1b8;
          sVar3 = std::char_traits<char>::length((char_type *)0x77b3b3);
          *psVar5 = sVar3;
          local_18 = local_1c0;
          local_2e0 = local_4c40;
          local_2f0 = local_4c50;
          sStack_2e8 = local_4c48;
          local_2f8 = local_4b48;
          local_110 = &local_2f0;
          local_308 = local_4c50;
          local_108 = local_308;
          txt = fmt::v9::
                make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                          (local_2f8,this_00,(char (*) [4608])local_2e0);
          local_90 = &local_318;
          local_98 = local_328;
          local_80 = 0xc;
          local_318 = 0xc;
          ch_00 = extraout_RDX;
          local_328[0] = txt;
          local_88 = local_98;
          local_78 = local_90;
          local_70 = local_98;
          local_310 = local_98;
          fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb530,in_stack_ffffffffffffb520);
          psVar4 = local_4c40;
          std::__cxx11::string::operator=(local_4b68,psVar4);
          std::__cxx11::string::~string(psVar4);
          std::__cxx11::string::c_str();
          send_to_char((char *)txt,ch_00);
          local_329 = 0;
          goto LAB_0077b5ac;
        }
        local_198 = local_4c20;
        local_1a0 = "The \'{}\' field for this area has been cleared.\n\r";
        local_190 = "The \'{}\' field for this area has been cleared.\n\r";
        local_4c20[0] = "The \'{}\' field for this area has been cleared.\n\r";
        local_188 = local_198;
        local_2b0 = std::char_traits<char>::length((char_type *)0x77b17b);
        local_8 = local_1a0;
        local_290 = local_4c10;
        local_2a0 = local_4c20[0];
        local_2a8 = local_4b48;
        local_130 = &local_2a0;
        local_2b8 = local_4c20[0];
        sStack_298 = local_2b0;
        local_128 = local_2b8;
        sStack_120 = local_2b0;
        local_2d8[0] = fmt::v9::
                       make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                                 (local_2a8,this_00,(char (*) [4608])local_290);
        local_c0 = &local_2c8;
        local_c8 = local_2d8;
        local_b0 = 0xc;
        local_2c8 = 0xc;
        local_b8 = local_c8;
        local_a8 = local_c0;
        local_a0 = local_c8;
        local_2c0 = local_c8;
        fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb530,in_stack_ffffffffffffb520);
        psVar4 = local_4c10;
        std::__cxx11::string::operator=(local_4b68,psVar4);
        std::__cxx11::string::~string(psVar4);
        std::__cxx11::string::c_str();
        send_to_char(in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8);
      }
    }
    else {
      aprog_set(in_stack_ffffffffffffb2e0,in_stack_ffffffffffffb2d8,in_stack_ffffffffffffb2d0);
      local_1a8 = local_4bf0;
      local_1b0 = "The \'{}\' field for this area as been set to the \'{}\' program.\n\r";
      local_180 = "The \'{}\' field for this area as been set to the \'{}\' program.\n\r";
      local_4bf0[0] = (char (*) [4608])0x82ced2;
      local_178 = local_1a8;
      local_1f0 = std::char_traits<char>::length((char_type *)0x77aee9);
      local_10 = local_1b0;
      local_1c8 = local_4be0;
      local_1d8 = local_4bf0[0];
      local_1e0 = (v9 *)local_4b48;
      local_1e8 = local_3948;
      local_60 = &local_1d8;
      local_1f8 = local_4bf0[0];
      sStack_1d0 = local_1f0;
      local_58 = local_1f8;
      sStack_50 = local_1f0;
      fmt::v9::
      make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608],char(&)[4608]>
                (&local_228,local_1e0,(char (*) [4608])local_1e8,local_4bf0[0]);
      local_40 = &local_208;
      local_48 = &local_228;
      local_30 = 0xcc;
      local_208 = 0xcc;
      local_38 = local_48;
      local_28 = local_40;
      local_20 = local_48;
      local_200 = local_48;
      fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb530,in_stack_ffffffffffffb520);
      std::__cxx11::string::operator=(local_4b68,local_4be0);
      std::__cxx11::string::~string(local_4be0);
      std::__cxx11::string::c_str();
      send_to_char(in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8);
    }
  }
  local_329 = 1;
LAB_0077b5ac:
  local_4b88 = 1;
  std::__cxx11::string::~string(local_4b68);
  return (bool)(local_329 & 1);
}

Assistant:

bool aedit_prog(CHAR_DATA *ch, char *argument)
{
	int count = 0, col = 0;
	char buf[MSL], add[MSL], prog[MSL], prog_type[MSL];
	std::string buffer;
	AREA_DATA *pArea;
	bool found = false;

	EDIT_AREA(ch, pArea);

	if (!*argument)
	{
		send_to_char("The following area programs are available:\n\r", ch);

		for (count = 0; aprog_table[count].type != nullptr; count++)
		{
			if (ch->pcdata->security < 10)
			{
				if (!str_cmp(ch->in_room->area->name, aprog_table[count].owner))
				{
					sprintf(buf, "%s ", aprog_table[count].name);
					send_to_char(buf, ch);
					col++;
				}
			}
			else
			{
				sprintf(buf, "%s ", aprog_table[count].name);
				send_to_char(buf, ch);
				col++;
			}

			if (col % 4 == 0 && col > 0)
				send_to_char("\n\r", ch);
		}
		if (col % 4 != 0)
			send_to_char("\n\r", ch);
	}
	else
	{
		argument = one_argument(argument, add);
		argument = one_argument(argument, prog);

		if (!*prog)
		{
			send_to_char("Syntax: prog add <prog_name>\n\r"\
						 "        prog del <prog_name>\n\r", ch);
			return false;
		}

		if (pArea->aprogs == nullptr)
		{
			pArea->aprogs = new APROG_DATA;
			CLEAR_MEM(pArea->aprogs, sizeof(APROG_DATA))
		}

		for (count = 0; aprog_table[count].type != nullptr; count++)
		{
			if (!str_cmp(aprog_table[count].name, prog))
			{
				sprintf(prog_type, "%s", aprog_table[count].type);
				found = true;
			}
		}

		if (!found)
		{
			buffer = fmt::format("{} is not a valid program to choose from.\n\r", prog); //TODO: change the rest of the sprintf calls to format
			send_to_char(buffer.c_str(), ch);
			return false;
		}
		else if (!str_prefix(add, "add"))
		{
			aprog_set(pArea, prog_type, prog);
			buffer = fmt::format("The '{}' field for this area as been set to the '{}' program.\n\r", prog_type, prog);
			send_to_char(buffer.c_str(), ch);
		}
		else if (!str_prefix(add, "del"))
		{
			if (aprog_unset(pArea, prog_type, prog))
			{
				buffer = fmt::format("The '{}' field for this area has been cleared.\n\r", prog_type);
				send_to_char(buffer.c_str(), ch);
			}
			else
			{
				buffer = fmt::format("The '{}' field is not set.\n\r", prog_type);
				send_to_char(buffer.c_str(), ch);
				return false;
			}
		}
	}

	return true;
}